

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_profile.c
# Opt level: O0

void lj_profile_interpreter(lua_State *L)

{
  global_State *g_00;
  int iVar1;
  byte local_21;
  int samples;
  uint8_t mask;
  global_State *g;
  ProfileState *ps;
  lua_State *L_local;
  
  iVar1 = profile_state.samples;
  g_00 = (global_State *)(L->glref).ptr64;
  local_21 = g_00->hookmask & 0x7f;
  if ((g_00->hookmask & 0x20) == 0) {
    profile_state.samples = 0;
    g_00->hookmask = ' ';
    lj_dispatch_update(g_00);
    (*profile_state.cb)(profile_state.data,L,iVar1,profile_state.vmstate);
    local_21 = local_21 | g_00->hookmask & 0x80;
  }
  g_00->hookmask = local_21;
  lj_dispatch_update(g_00);
  return;
}

Assistant:

void LJ_FASTCALL lj_profile_interpreter(lua_State *L)
{
  ProfileState *ps = &profile_state;
  global_State *g = G(L);
  uint8_t mask;
  profile_lock(ps);
  mask = (g->hookmask & ~HOOK_PROFILE);
  if (!(mask & HOOK_VMEVENT)) {
    int samples = ps->samples;
    ps->samples = 0;
    g->hookmask = HOOK_VMEVENT;
    lj_dispatch_update(g);
    profile_unlock(ps);
    ps->cb(ps->data, L, samples, ps->vmstate);  /* Invoke user callback. */
    profile_lock(ps);
    mask |= (g->hookmask & HOOK_PROFILE);
  }
  g->hookmask = mask;
  lj_dispatch_update(g);
  profile_unlock(ps);
}